

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * str_hasnextword(char *buffer,char *word)

{
  ushort *puVar1;
  char cVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  if (buffer != (char *)0x0) {
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    do {
      pcVar7 = buffer;
      buffer = pcVar7 + 1;
    } while ((puVar1[*pcVar7] & 1) != 0);
    cVar5 = *word;
    bVar9 = cVar5 == '\0';
    if (!bVar9) {
      cVar2 = *pcVar7;
      pcVar6 = pcVar7;
      if (cVar2 != '\0') {
        pcVar8 = word + 1;
        pcVar7 = pcVar7 + 1;
        do {
          if ((puVar1[cVar2] & 1) != 0) break;
          pp_Var4 = __ctype_tolower_loc();
          if ((*pp_Var4)[cVar5] != (*pp_Var4)[cVar2]) goto LAB_00129f3e;
          cVar5 = *pcVar8;
          bVar9 = cVar5 == '\0';
          if (bVar9) goto LAB_00129f49;
          pcVar6 = pcVar6 + 1;
          cVar2 = *pcVar7;
          pcVar8 = pcVar8 + 1;
          pcVar7 = pcVar7 + 1;
        } while (cVar2 != '\0');
        pcVar6 = pcVar7 + -1;
      }
LAB_00129f3e:
      pcVar7 = pcVar6;
      if (!bVar9) {
        return (char *)0x0;
      }
    }
LAB_00129f49:
    if (((long)*pcVar7 == 0) || ((puVar1[*pcVar7] & 1) != 0)) {
      pcVar7 = pcVar7 + -1;
      do {
        pcVar6 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
      } while ((puVar1[*pcVar6] & 1) != 0);
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
str_hasnextword(const char *buffer, const char *word) {
  /* sanity check */
  if (buffer == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*buffer)) {
    buffer++;
  }

  while (*word != 0 && *buffer != 0 && !isblank(*buffer) && tolower(*word) == tolower(*buffer)) {
    word++;
    buffer++;
  }

  /* complete match ? */
  if (*word == 0 && (*buffer == 0 || isblank(*buffer))) {
    while (isblank(*buffer)) {
      buffer++;
    }
    return buffer;
  }
  return NULL;
}